

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

Vec4 __thiscall
deqp::gles31::Functional::anon_unknown_1::getRandomColor(anon_unknown_1 *this,Random *rnd)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  Vec4 VVar4;
  
  fVar1 = deRandom_getFloat(&rnd->m_rnd);
  fVar2 = deRandom_getFloat(&rnd->m_rnd);
  fVar3 = deRandom_getFloat(&rnd->m_rnd);
  VVar4.m_data[0] = fVar3 * 0.7 + 0.2;
  VVar4.m_data._8_8_ = CONCAT44(fVar2 * (float)0x3f333333 + 0.2,fVar1 * (float)0x3f333333 + 0.2);
  *(undefined8 *)this = VVar4.m_data._8_8_;
  *(float *)(this + 8) = VVar4.m_data[0];
  *(undefined4 *)(this + 0xc) = 0x3f800000;
  VVar4.m_data[1] = (float)extraout_XMM0_Db;
  return (Vec4)VVar4.m_data;
}

Assistant:

Vec4 getRandomColor (de::Random& rnd)
{
	const float r = rnd.getFloat(0.2f, 0.9f);
	const float g = rnd.getFloat(0.2f, 0.9f);
	const float b = rnd.getFloat(0.2f, 0.9f);
	return Vec4(r, g, b, 1.0f);
}